

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O2

void ihevc_intra_pred_luma_horz_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  UWORD8 aUVar6 [16];
  undefined1 (*pauVar7) [16];
  long lVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [16];
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  short sVar21;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  undefined1 in_XMM3 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  aUVar6 = IHEVCE_SHUFFLEMASK4;
  uVar5 = nt * 2;
  if (nt == 0x20) {
    pauVar7 = (undefined1 (*) [16])(pu1_ref + uVar5);
    pauVar10 = (undefined1 (*) [16])(pu1_dst + 0x10);
    lVar8 = (long)dst_strd;
    for (uVar9 = 0; pauVar7 = pauVar7 + -1, uVar9 < 0x20; uVar9 = uVar9 + 0x10) {
      auVar36 = *pauVar7;
      auVar35 = pshufb(auVar36 >> 0x38,(undefined1  [16])aUVar6);
      auVar34 = pshufb(auVar36 >> 0x30,(undefined1  [16])aUVar6);
      auVar33 = pshufb(auVar36 >> 0x28,(undefined1  [16])aUVar6);
      auVar32 = pshufb(auVar36 >> 0x20,(undefined1  [16])aUVar6);
      auVar31 = pshufb(auVar36 >> 0x18,(undefined1  [16])aUVar6);
      auVar22 = pshufb(auVar36 >> 0x10,(undefined1  [16])aUVar6);
      auVar23 = pshufb(auVar36 >> 8,(undefined1  [16])aUVar6);
      auVar19 = pshufb(auVar36,(undefined1  [16])aUVar6);
      auVar20 = pshufb(auVar36 >> 0x78,(undefined1  [16])aUVar6);
      auVar42 = pshufb(auVar36 >> 0x70,(undefined1  [16])aUVar6);
      auVar41 = pshufb(auVar36 >> 0x68,(undefined1  [16])aUVar6);
      auVar40 = pshufb(auVar36 >> 0x60,(undefined1  [16])aUVar6);
      auVar39 = pshufb(auVar36 >> 0x58,(undefined1  [16])aUVar6);
      auVar38 = pshufb(auVar36 >> 0x50,(undefined1  [16])aUVar6);
      auVar37 = pshufb(auVar36 >> 0x48,(undefined1  [16])aUVar6);
      auVar36 = pshufb(auVar36 >> 0x40,(undefined1  [16])aUVar6);
      pauVar10[-1] = auVar20;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8) = auVar42;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 2) = auVar41;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 3) = auVar40;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 4) = auVar39;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 5) = auVar38;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 6) = auVar37;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 7) = auVar36;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 8) = auVar35;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 9) = auVar34;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 10) = auVar33;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 0xb) = auVar32;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 0xc) = auVar31;
      local_48 = auVar22._0_8_;
      uStack_40 = auVar22._8_8_;
      *(undefined8 *)(pauVar10[-1] + lVar8 * 0xd) = local_48;
      *(undefined8 *)(pauVar10[-1] + lVar8 * 0xd + 8) = uStack_40;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 0xe) = auVar23;
      *(undefined1 (*) [16])(pauVar10[-1] + lVar8 * 0xf) = auVar19;
      *pauVar10 = auVar20;
      *(undefined1 (*) [16])(*pauVar10 + lVar8) = auVar42;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 2) = auVar41;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 3) = auVar40;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 4) = auVar39;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 5) = auVar38;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 6) = auVar37;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 7) = auVar36;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 8) = auVar35;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 9) = auVar34;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 10) = auVar33;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 0xb) = auVar32;
      local_58 = auVar31._0_8_;
      uStack_50 = auVar31._8_8_;
      *(undefined8 *)(*pauVar10 + lVar8 * 0xc) = local_58;
      *(undefined8 *)(*pauVar10 + lVar8 * 0xc + 8) = uStack_50;
      *(undefined8 *)(*pauVar10 + lVar8 * 0xd) = local_48;
      *(undefined8 *)(*pauVar10 + lVar8 * 0xd + 8) = uStack_40;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 0xe) = auVar23;
      *(undefined1 (*) [16])(*pauVar10 + lVar8 * 0xf) = auVar19;
      pauVar10 = pauVar10 + lVar8;
    }
    return;
  }
  auVar36 = pshuflw(ZEXT116(pu1_ref[(long)(int)uVar5 + -1]),ZEXT116(pu1_ref[(long)(int)uVar5 + -1]),
                    0);
  auVar19 = pshuflw(ZEXT116(pu1_ref[(int)uVar5]),ZEXT116(pu1_ref[(int)uVar5]),0);
  auVar20 = pmovzxbw(auVar19,*(undefined8 *)(pu1_ref + (long)(int)uVar5 + 1));
  sVar21 = auVar19._0_2_;
  auVar22._0_2_ = auVar20._0_2_ - sVar21;
  sVar24 = auVar19._2_2_;
  auVar22._2_2_ = auVar20._2_2_ - sVar24;
  auVar22._4_2_ = auVar20._4_2_ - sVar21;
  auVar22._6_2_ = auVar20._6_2_ - sVar24;
  auVar22._8_2_ = auVar20._8_2_ - sVar21;
  auVar22._10_2_ = auVar20._10_2_ - sVar24;
  auVar22._12_2_ = auVar20._12_2_ - sVar21;
  auVar22._14_2_ = auVar20._14_2_ - sVar24;
  auVar19 = psraw(auVar22,1);
  sVar29 = auVar36._0_2_;
  sVar11 = auVar19._0_2_ + sVar29;
  sVar30 = auVar36._2_2_;
  sVar12 = auVar19._2_2_ + sVar30;
  sVar13 = auVar19._4_2_ + sVar29;
  sVar14 = auVar19._6_2_ + sVar30;
  sVar15 = auVar19._8_2_ + sVar29;
  sVar16 = auVar19._10_2_ + sVar30;
  sVar17 = auVar19._12_2_ + sVar29;
  sVar18 = auVar19._14_2_ + sVar30;
  cVar1 = (char)sVar11;
  cVar2 = (char)sVar12;
  cVar3 = (char)sVar13;
  cVar4 = (char)sVar14;
  if (nt == 0x10) {
    auVar36 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + (long)(int)uVar5 + 9));
    auVar19._0_2_ = auVar36._0_2_ - sVar21;
    auVar19._2_2_ = auVar36._2_2_ - sVar24;
    auVar19._4_2_ = auVar36._4_2_ - sVar21;
    auVar19._6_2_ = auVar36._6_2_ - sVar24;
    auVar19._8_2_ = auVar36._8_2_ - sVar21;
    auVar19._10_2_ = auVar36._10_2_ - sVar24;
    auVar19._12_2_ = auVar36._12_2_ - sVar21;
    auVar19._14_2_ = auVar36._14_2_ - sVar24;
    auVar36 = psraw(auVar19,1);
    sVar21 = auVar36._0_2_ + sVar29;
    sVar24 = auVar36._2_2_ + sVar30;
    sVar25 = auVar36._4_2_ + sVar29;
    sVar26 = auVar36._6_2_ + sVar30;
    sVar27 = auVar36._8_2_ + sVar29;
    sVar28 = auVar36._10_2_ + sVar30;
    sVar29 = auVar36._12_2_ + sVar29;
    sVar30 = auVar36._14_2_ + sVar30;
    *pu1_dst = (0 < sVar11) * (sVar11 < 0x100) * cVar1 - (0xff < sVar11);
    pu1_dst[1] = (0 < sVar12) * (sVar12 < 0x100) * cVar2 - (0xff < sVar12);
    pu1_dst[2] = (0 < sVar13) * (sVar13 < 0x100) * cVar3 - (0xff < sVar13);
    pu1_dst[3] = (0 < sVar14) * (sVar14 < 0x100) * cVar4 - (0xff < sVar14);
    pu1_dst[4] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    pu1_dst[5] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    pu1_dst[6] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    pu1_dst[7] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    pu1_dst[8] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    pu1_dst[9] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    pu1_dst[10] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    pu1_dst[0xb] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
    pu1_dst[0xc] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
    pu1_dst[0xd] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
    pu1_dst[0xe] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
    pu1_dst[0xf] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
    auVar36 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 2]),(undefined1  [16])0x0);
    auVar19 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 3]),(undefined1  [16])0x0);
    auVar20 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 4]),(undefined1  [16])0x0);
    auVar22 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 5]),(undefined1  [16])0x0);
    auVar23 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 6]),(undefined1  [16])0x0);
    auVar31 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 7]),(undefined1  [16])0x0);
    auVar32 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 8]),(undefined1  [16])0x0);
    auVar33 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 9]),(undefined1  [16])0x0);
    lVar8 = (long)dst_strd;
    *(undefined1 (*) [16])(pu1_dst + lVar8) = auVar36;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 2) = auVar19;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 3) = auVar20;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 4) = auVar22;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 5) = auVar23;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 6) = auVar31;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 7) = auVar32;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 8) = auVar33;
    auVar36 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 10]),(undefined1  [16])0x0);
    auVar19 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 0xb]),(undefined1  [16])0x0);
    auVar20 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 0xc]),(undefined1  [16])0x0);
    auVar22 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 0xd]),(undefined1  [16])0x0);
    auVar23 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 0xe]),(undefined1  [16])0x0);
    auVar31 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 0xf]),(undefined1  [16])0x0);
    auVar32 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 0x10]),(undefined1  [16])0x0);
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 9) = auVar36;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 10) = auVar19;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 0xb) = auVar20;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 0xc) = auVar22;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 0xd) = auVar23;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 0xe) = auVar31;
    *(undefined1 (*) [16])(pu1_dst + lVar8 * 0xf) = auVar32;
  }
  else {
    if (nt == 8) {
      auVar36 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 2]),(undefined1  [16])0x0);
      auVar19 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 3]),(undefined1  [16])0x0);
      auVar20 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 4]),(undefined1  [16])0x0);
      auVar22 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 5]),(undefined1  [16])0x0);
      auVar23 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 6]),(undefined1  [16])0x0);
      auVar31 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 7]),(undefined1  [16])0x0);
      auVar32 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 8]),(undefined1  [16])0x0);
      *(ulong *)pu1_dst =
           CONCAT17((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18),
                    CONCAT16((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17),
                             CONCAT15((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 -
                                      (0xff < sVar16),
                                      CONCAT14((0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 -
                                               (0xff < sVar15),
                                               CONCAT13((0 < sVar14) * (sVar14 < 0x100) * cVar4 -
                                                        (0xff < sVar14),
                                                        CONCAT12((0 < sVar13) * (sVar13 < 0x100) *
                                                                 cVar3 - (0xff < sVar13),
                                                                 CONCAT11((0 < sVar12) *
                                                                          (sVar12 < 0x100) * cVar2 -
                                                                          (0xff < sVar12),
                                                                          (0 < sVar11) *
                                                                          (sVar11 < 0x100) * cVar1 -
                                                                          (0xff < sVar11))))))));
      lVar8 = (long)dst_strd;
      *(long *)(pu1_dst + lVar8) = auVar36._0_8_;
      *(long *)(pu1_dst + lVar8 * 2) = auVar19._0_8_;
      *(long *)(pu1_dst + lVar8 * 3) = auVar20._0_8_;
      *(long *)(pu1_dst + lVar8 * 4) = auVar22._0_8_;
      *(long *)(pu1_dst + lVar8 * 5) = auVar23._0_8_;
      *(long *)(pu1_dst + lVar8 * 6) = auVar31._0_8_;
      *(long *)(pu1_dst + lVar8 * 7) = auVar32._0_8_;
      return;
    }
    if (nt == 4) {
      *(uint *)pu1_dst =
           CONCAT13((0 < sVar14) * (sVar14 < 0x100) * cVar4 - (0xff < sVar14),
                    CONCAT12((0 < sVar13) * (sVar13 < 0x100) * cVar3 - (0xff < sVar13),
                             CONCAT11((0 < sVar12) * (sVar12 < 0x100) * cVar2 - (0xff < sVar12),
                                      (0 < sVar11) * (sVar11 < 0x100) * cVar1 - (0xff < sVar11))));
      auVar36 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 2]),(undefined1  [16])0x0);
      auVar19 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 3]),(undefined1  [16])0x0);
      auVar20 = pshufb(ZEXT116(pu1_ref[(ulong)uVar5 - 4]),(undefined1  [16])0x0);
      lVar8 = (long)dst_strd;
      *(int *)(pu1_dst + lVar8) = auVar36._0_4_;
      *(int *)(pu1_dst + lVar8 * 2) = auVar19._0_4_;
      *(int *)(pu1_dst + lVar8 * 3) = auVar20._0_4_;
      return;
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_horz_sse42(UWORD8 *pu1_ref,
                                      WORD32 src_strd,
                                      UWORD8 *pu1_dst,
                                      WORD32 dst_strd,
                                      WORD32 nt,
                                      WORD32 mode)
{

    WORD32 row;
    WORD32 two_nt;
    UNUSED(src_strd);
    UNUSED(mode);

    two_nt = 2 * nt;


    if(nt == 32)
    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6, src_temp7, src_temp8;
        __m128i src_temp9, src_temp10, src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16;
        __m128i sm = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        for(row = 0; row < nt; row += 16)
        {
            {
                src_temp1 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt - 1 - row - 15));

                src_temp2 =  _mm_srli_si128(src_temp1, 1);
                src_temp3 =  _mm_srli_si128(src_temp1, 2);
                src_temp4 =  _mm_srli_si128(src_temp1, 3);
                src_temp5 =  _mm_srli_si128(src_temp1, 4);
                src_temp6 =  _mm_srli_si128(src_temp1, 5);
                src_temp7 =  _mm_srli_si128(src_temp1, 6);
                src_temp8 =  _mm_srli_si128(src_temp1, 7);

                src_temp9 =  _mm_srli_si128(src_temp1, 8);
                src_temp10 =  _mm_srli_si128(src_temp1, 9);
                src_temp11 =  _mm_srli_si128(src_temp1, 10);
                src_temp12 =  _mm_srli_si128(src_temp1, 11);
                src_temp13 =  _mm_srli_si128(src_temp1, 12);
                src_temp14 =  _mm_srli_si128(src_temp1, 13);
                src_temp15 =  _mm_srli_si128(src_temp1, 14);
                src_temp16 =  _mm_srli_si128(src_temp1, 15);

                src_temp8 =  _mm_shuffle_epi8(src_temp8, sm);
                src_temp7 =  _mm_shuffle_epi8(src_temp7, sm);
                src_temp6 =  _mm_shuffle_epi8(src_temp6, sm);
                src_temp5 =  _mm_shuffle_epi8(src_temp5, sm);
                src_temp4 =  _mm_shuffle_epi8(src_temp4, sm);
                src_temp3 =  _mm_shuffle_epi8(src_temp3, sm);
                src_temp2 =  _mm_shuffle_epi8(src_temp2, sm);
                src_temp1 =  _mm_shuffle_epi8(src_temp1, sm);

                src_temp16 =  _mm_shuffle_epi8(src_temp16, sm);
                src_temp15 =  _mm_shuffle_epi8(src_temp15, sm);
                src_temp14 =  _mm_shuffle_epi8(src_temp14, sm);
                src_temp13 =  _mm_shuffle_epi8(src_temp13, sm);
                src_temp12 =  _mm_shuffle_epi8(src_temp12, sm);
                src_temp11 =  _mm_shuffle_epi8(src_temp11, sm);
                src_temp10 =  _mm_shuffle_epi8(src_temp10, sm);
                src_temp9 =  _mm_shuffle_epi8(src_temp9, sm);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 15) * dst_strd)), src_temp1);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 0) * dst_strd)), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 1) * dst_strd)), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 2) * dst_strd)), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 3) * dst_strd)), src_temp13);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 4) * dst_strd)), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 5) * dst_strd)), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 6) * dst_strd)), src_temp10);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 7) * dst_strd)), src_temp9);

                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 8) * dst_strd)), src_temp8);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 9) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 10) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 11) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 12) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 13) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 14) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((row + 15) * dst_strd)), src_temp1);

            }

        }

    }
    else

    {
        __m128i src_temp1, src_temp2, src_temp3, src_temp4, src_temp5, src_temp6;
        __m128i src_temp10, zero_8x16b, src_temp7;

        /* DC filtering for the first top row and first left column */

        zero_8x16b = _mm_set1_epi16(0);

        /*Filtering done for the 1st row */

        src_temp2 =  _mm_set1_epi16(pu1_ref[two_nt - 1]);
        src_temp10 =  _mm_set1_epi16(pu1_ref[two_nt]);

        /*  loding 8-bit 16 pixels */
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

        src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

        /*(pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt])*/
        src_temp3 = _mm_sub_epi16(src_temp4, src_temp10);

        /* ((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_srai_epi16(src_temp3, 1);

        /* pu1_ref[two_nt - 1]+((pu1_ref[two_nt + 1 + col] - pu1_ref[two_nt]) >> 1)*/
        src_temp3 = _mm_add_epi16(src_temp2, src_temp3);

        if(nt == 4)
        {
            int temp1, temp2, temp3;
            src_temp3 = _mm_packus_epi16(src_temp3, zero_8x16b);
            temp1 = _mm_cvtsi128_si32(src_temp3);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

        }
        else if(nt == 8)
        {
            src_temp10 = _mm_packus_epi16(src_temp3, zero_8x16b);


            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp10);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            _mm_storel_epi64((__m128i *)(pu1_dst + (1 * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + (2 * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + (3 * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + (4 * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + (5 * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + (6 * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + (7 * dst_strd)), src_temp7);

        }
        else if(nt == 16)
        {
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));
            src_temp4 =  _mm_cvtepu8_epi16(src_temp4);

            src_temp10 = _mm_sub_epi16(src_temp4, src_temp10);
            src_temp10 = _mm_srai_epi16(src_temp10, 1);
            src_temp10 = _mm_add_epi16(src_temp2, src_temp10);

            src_temp3 = _mm_packus_epi16(src_temp3, src_temp10);
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp3);

            /*pu1_dst[(row * dst_strd) + col] = pu1_ref[two_nt - 1 - row];*/
            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 2]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 3]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 4]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 5]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 6]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 7]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 8]);
            src_temp10 =  _mm_set1_epi8(pu1_ref[two_nt - 9]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp10);

            src_temp1 =  _mm_set1_epi8(pu1_ref[two_nt - 10]);
            src_temp2 =  _mm_set1_epi8(pu1_ref[two_nt - 11]);
            src_temp3 =  _mm_set1_epi8(pu1_ref[two_nt - 12]);
            src_temp4 =  _mm_set1_epi8(pu1_ref[two_nt - 13]);
            src_temp5 =  _mm_set1_epi8(pu1_ref[two_nt - 14]);
            src_temp6 =  _mm_set1_epi8(pu1_ref[two_nt - 15]);
            src_temp7 =  _mm_set1_epi8(pu1_ref[two_nt - 16]);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp4);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp7);

        }
    }
}